

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

DWORD __thiscall
FNodeBuilder::PushGLSeg
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          FPrivSeg *seg,vertex_t *outVerts)

{
  uint uVar1;
  glseg_t local_50;
  
  local_50.super_seg_t.v1 = outVerts + seg->v1;
  local_50.super_seg_t.v2 = outVerts + seg->v2;
  local_50.super_seg_t.frontsector = seg->frontsector;
  local_50.super_seg_t.backsector = seg->backsector;
  if ((long)seg->linedef == -1) {
    local_50.super_seg_t.linedef = (line_t *)0x0;
    local_50.super_seg_t.sidedef = (side_t *)0x0;
  }
  else {
    local_50.super_seg_t.linedef = this->Level->Lines + seg->linedef;
    local_50.super_seg_t.sidedef = this->Level->Sides + seg->sidedef;
  }
  local_50.Partner = seg->partner;
  uVar1 = TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::Push(segs,&local_50);
  return uVar1;
}

Assistant:

DWORD FNodeBuilder::PushGLSeg (TArray<glseg_t> &segs, const FPrivSeg *seg, vertex_t *outVerts)
{
	glseg_t newseg;

	newseg.v1 = outVerts + seg->v1;
	newseg.v2 = outVerts + seg->v2;
	newseg.backsector = seg->backsector;
	newseg.frontsector = seg->frontsector;
	if (seg->linedef != -1)
	{
		newseg.linedef = Level.Lines + seg->linedef;
		newseg.sidedef = Level.Sides + seg->sidedef;
	}
	else
	{
		newseg.linedef = NULL;
		newseg.sidedef = NULL;
	}
	newseg.Partner = seg->partner;
	return (DWORD)segs.Push (newseg);
}